

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O0

xmlChar * xmlSchemaNormalizeValue(xmlSchemaTypePtr type,xmlChar *value)

{
  xmlSchemaWhitespaceValueType xVar1;
  xmlChar *value_local;
  xmlSchemaTypePtr type_local;
  
  xVar1 = xmlSchemaGetWhiteSpaceFacetValue(type);
  if (xVar1 == XML_SCHEMA_WHITESPACE_REPLACE) {
    type_local = (xmlSchemaTypePtr)xmlSchemaWhiteSpaceReplace(value);
  }
  else if (xVar1 == XML_SCHEMA_WHITESPACE_COLLAPSE) {
    type_local = (xmlSchemaTypePtr)xmlSchemaCollapseString(value);
  }
  else {
    type_local = (xmlSchemaTypePtr)0x0;
  }
  return (xmlChar *)type_local;
}

Assistant:

static xmlChar *
xmlSchemaNormalizeValue(xmlSchemaTypePtr type,
			const xmlChar *value)
{
    switch (xmlSchemaGetWhiteSpaceFacetValue(type)) {
	case XML_SCHEMA_WHITESPACE_COLLAPSE:
	    return (xmlSchemaCollapseString(value));
	case XML_SCHEMA_WHITESPACE_REPLACE:
	    return (xmlSchemaWhiteSpaceReplace(value));
	default:
	    return (NULL);
    }
}